

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

optional<LockPoints> *
CalculateLockPointsAtTip
          (optional<LockPoints> *__return_storage_ptr__,CBlockIndex *tip,CCoinsView *coins_view,
          CTransaction *tx)

{
  int iVar1;
  CBlockIndex *pCVar2;
  int iVar3;
  string_view source_file;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  Logger *pLVar8;
  pointer piVar9;
  CBlockIndex **ppCVar10;
  pointer pCVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  pair<int,_long> pVar12;
  CBlockIndex next_tip;
  string log_msg;
  ulong local_1e0;
  vector<int,_std::allocator<int>_> local_1d8;
  vector<int,_std::allocator<int>_> local_1b8;
  byte local_1a0;
  undefined1 local_198 [32];
  undefined8 local_178;
  ulong uStack_170;
  uint32_t auStack_168 [8];
  uint64_t local_148;
  undefined8 uStack_140;
  uchar local_138 [64];
  string local_f8 [4];
  string local_78;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (tip == (CBlockIndex *)0x0) {
    __assert_fail("tip",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ,0xcd,
                  "std::optional<LockPoints> CalculateLockPointsAtTip(CBlockIndex *, const CCoinsView &, const CTransaction &)"
                 );
  }
  local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize
            (&local_1d8,
             ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5);
  local_1e0 = 0;
  pCVar11 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != pCVar11) {
    do {
      uVar4 = local_1e0;
      CTxOut::CTxOut((CTxOut *)local_198);
      uStack_170 = uStack_170 & 0xffffffff00000000;
      iVar6 = (**coins_view->_vptr_CCoinsView)(coins_view,pCVar11 + uVar4,(CTxOut *)local_198);
      if ((char)iVar6 == '\0') {
        base_blob<256u>::GetHex_abi_cxx11_(local_f8,&tx->hash);
        pLVar8 = LogInstance();
        bVar5 = BCLog::Logger::Enabled(pLVar8);
        if (bVar5) {
          local_58._0_8_ = local_58 + 0x10;
          local_58._8_8_ = 0;
          local_58[0x10] = '\0';
          tinyformat::format<char[21],unsigned_long,std::__cxx11::string>
                    (&local_78,(tinyformat *)"ERROR: %s: Missing input %d in transaction \'%s\'\n",
                     "CalculatePrevHeights",(char (*) [21])&local_1e0,(unsigned_long *)local_f8,
                     in_R9);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     &local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          pLVar8 = LogInstance();
          local_78._M_dataplus._M_p = (pointer)0x57;
          local_78._M_string_length = 0x837769;
          in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xba;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
          ;
          source_file._M_len = 0x57;
          str._M_str = (char *)local_58._0_8_;
          str._M_len = local_58._8_8_;
          logging_function._M_str = "CalculatePrevHeights";
          logging_function._M_len = 0x14;
          BCLog::Logger::LogPrintStr(pLVar8,str,logging_function,source_file,0xba,ALL,Info);
          if ((CBlockIndex *)local_58._0_8_ != (CBlockIndex *)(local_58 + 0x10)) {
            operator_delete((void *)local_58._0_8_,CONCAT71(local_58._17_7_,local_58[0x10]) + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8[0]._M_dataplus._M_p != &local_f8[0].field_2) {
          operator_delete(local_f8[0]._M_dataplus._M_p,local_f8[0].field_2._M_allocated_capacity + 1
                         );
        }
        local_1a0 = 0;
      }
      else {
        uVar7 = (uint)uStack_170 >> 1;
        if (uVar7 == 0x7fffffff) {
          uVar7 = tip->nHeight + 1;
        }
        local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[local_1e0] = uVar7;
      }
      if (0x1c < local_178._4_4_) {
        free((void *)local_198._8_8_);
      }
      if ((char)iVar6 == '\0') {
        if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        goto LAB_003f3379;
      }
      local_1e0 = local_1e0 + 1;
      pCVar11 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (local_1e0 <
             (ulong)(((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pCVar11 >> 3) *
                    0x4ec4ec4ec4ec4ec5));
  }
  local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
  local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_1a0 = 1;
LAB_003f3379:
  if (local_1a0 == 0) {
    (__return_storage_ptr__->super__Optional_base<LockPoints,_true,_true>)._M_payload.
    super__Optional_payload_base<LockPoints>._M_engaged = false;
  }
  else {
    local_198._0_8_ = (uint256 *)0x0;
    auStack_168[4] = 0;
    auStack_168[5] = 0;
    auStack_168[6] = 0;
    auStack_168[0] = 0;
    auStack_168[1] = 0;
    auStack_168[2] = 0;
    auStack_168[3] = 0;
    local_178 = 0;
    uStack_170 = 0;
    local_198._16_8_ = 0;
    local_148 = 0;
    uStack_140._0_4_ = 0;
    uStack_140._4_4_ = 0;
    local_138[0] = '\0';
    local_138[1] = '\0';
    local_138[2] = '\0';
    local_138[3] = '\0';
    local_138[4] = '\0';
    local_138[5] = '\0';
    local_138[6] = '\0';
    local_138[7] = '\0';
    local_138[8] = '\0';
    local_138[9] = '\0';
    local_138[10] = '\0';
    local_138[0xb] = '\0';
    local_138[0xc] = '\0';
    local_138[0xd] = '\0';
    local_138[0xe] = '\0';
    local_138[0xf] = '\0';
    local_138[0x10] = '\0';
    local_138[0x11] = '\0';
    local_138[0x12] = '\0';
    local_138[0x13] = '\0';
    local_138[0x14] = '\0';
    local_138[0x15] = '\0';
    local_138[0x16] = '\0';
    local_138[0x17] = '\0';
    local_138[0x18] = '\0';
    local_138[0x19] = '\0';
    local_138[0x1a] = '\0';
    local_138[0x1b] = '\0';
    local_138[0x1c] = '\0';
    local_138[0x1d] = '\0';
    local_138[0x1e] = '\0';
    local_138[0x1f] = '\0';
    local_138._32_8_ = 0;
    local_138._40_8_ = 0;
    local_138[0x30] = '\0';
    local_138[0x31] = '\0';
    local_138[0x32] = '\0';
    local_138[0x33] = '\0';
    local_198._28_4_ = 0;
    local_198._24_4_ = tip->nHeight + 1;
    local_198._8_8_ = tip;
    pVar12 = CalculateSequenceLocks(tx,1,&local_1b8,(CBlockIndex *)local_198);
    if (local_1a0 == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_003f36b1;
    }
    if (local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      iVar6 = 0;
    }
    else {
      iVar6 = 0;
      piVar9 = local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        iVar1 = *piVar9;
        iVar3 = iVar1;
        if (iVar1 < iVar6) {
          iVar3 = iVar6;
        }
        if (iVar1 == local_198._24_4_) {
          iVar3 = iVar6;
        }
        iVar6 = iVar3;
        piVar9 = piVar9 + 1;
      } while (piVar9 != local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    local_58._0_8_ = CBlockIndex::GetAncestor(tip,iVar6);
    ppCVar10 = inline_assertion_check<true,CBlockIndex*>
                         ((CBlockIndex **)local_58,
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0xf2,"CalculateLockPointsAtTip","tip->GetAncestor(max_input_height)");
    pCVar2 = *ppCVar10;
    (__return_storage_ptr__->super__Optional_base<LockPoints,_true,_true>)._M_payload.
    super__Optional_payload_base<LockPoints>._M_payload._M_value.height = pVar12.first;
    (__return_storage_ptr__->super__Optional_base<LockPoints,_true,_true>)._M_payload.
    super__Optional_payload_base<LockPoints>._M_payload._M_value.time = pVar12.second;
    (__return_storage_ptr__->super__Optional_base<LockPoints,_true,_true>)._M_payload.
    super__Optional_payload_base<LockPoints>._M_payload._M_value.maxInputBlock = pCVar2;
    (__return_storage_ptr__->super__Optional_base<LockPoints,_true,_true>)._M_payload.
    super__Optional_payload_base<LockPoints>._M_engaged = true;
  }
  if (((local_1a0 & 1) != 0) &&
     (local_1a0 = 0,
     local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_start != (int *)0x0)) {
    operator_delete(local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_003f36b1:
  __stack_chk_fail();
}

Assistant:

std::optional<LockPoints> CalculateLockPointsAtTip(
    CBlockIndex* tip,
    const CCoinsView& coins_view,
    const CTransaction& tx)
{
    assert(tip);

    auto prev_heights{CalculatePrevHeights(*tip, coins_view, tx)};
    if (!prev_heights.has_value()) return std::nullopt;

    CBlockIndex next_tip;
    next_tip.pprev = tip;
    // When SequenceLocks() is called within ConnectBlock(), the height
    // of the block *being* evaluated is what is used.
    // Thus if we want to know if a transaction can be part of the
    // *next* block, we need to use one more than active_chainstate.m_chain.Height()
    next_tip.nHeight = tip->nHeight + 1;
    const auto [min_height, min_time] = CalculateSequenceLocks(tx, STANDARD_LOCKTIME_VERIFY_FLAGS, prev_heights.value(), next_tip);

    // Also store the hash of the block with the highest height of
    // all the blocks which have sequence locked prevouts.
    // This hash needs to still be on the chain
    // for these LockPoint calculations to be valid
    // Note: It is impossible to correctly calculate a maxInputBlock
    // if any of the sequence locked inputs depend on unconfirmed txs,
    // except in the special case where the relative lock time/height
    // is 0, which is equivalent to no sequence lock. Since we assume
    // input height of tip+1 for mempool txs and test the resulting
    // min_height and min_time from CalculateSequenceLocks against tip+1.
    int max_input_height{0};
    for (const int height : prev_heights.value()) {
        // Can ignore mempool inputs since we'll fail if they had non-zero locks
        if (height != next_tip.nHeight) {
            max_input_height = std::max(max_input_height, height);
        }
    }

    // tip->GetAncestor(max_input_height) should never return a nullptr
    // because max_input_height is always less than the tip height.
    // It would, however, be a bad bug to continue execution, since a
    // LockPoints object with the maxInputBlock member set to nullptr
    // signifies no relative lock time.
    return LockPoints{min_height, min_time, Assert(tip->GetAncestor(max_input_height))};
}